

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymLocal::gen_code_call
          (CTcSymLocal *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  undefined4 in_register_0000000c;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int in_ESI;
  long *in_RDI;
  CTcGenTarg *in_R8;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  CTcNamedArgs *in_stack_ffffffffffffffd8;
  
  iVar2 = in_ECX;
  (**(code **)(*in_RDI + 0xc0))(in_RDI,0);
  if (in_ECX != 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  }
  iVar1 = CTcGenTarg::is_speculative(G_cg);
  if (iVar1 != 0) {
    err_throw(0);
  }
  CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  CTcDataStream::write
            (&G_cs->super_CTcDataStream,(int)(char)in_EDX,
             (void *)CONCAT44(extraout_var,extraout_EDX),CONCAT44(in_register_0000000c,iVar2));
  CTcGenTarg::note_pop(G_cg,in_EDX + 1);
  CTcGenTarg::post_call_cleanup(in_R8,in_stack_ffffffffffffffd8);
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_push((CTcGenTarg *)0x284cf5);
  }
  return;
}

Assistant:

void CTcSymLocal::gen_code_call(
    int discard, int argc, int varargs, CTcNamedArgs *named_args)
{
    /* 
     *   to call a local, we'll simply evaluate the local normally, then
     *   call through the resulting (presumed) property or function
     *   pointer value 
     */
    gen_code(FALSE);

    /* 
     *   if we have a varargs list, modify the call instruction that
     *   follows to make it a varargs call 
     */
    if (varargs)
    {
        /* swap the top of the stack to get the arg counter back on top */
        G_cg->write_op(OPC_SWAP);

        /* write the varargs modifier */
        G_cg->write_op(OPC_VARARGC);
    }

    /* don't allow this at all in speculative mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* call the result as a function or method pointer */
    G_cg->write_op(OPC_PTRCALL);
    G_cs->write((char)argc);

    /* ptrcall removes the arguments and the function pointer */
    G_cg->note_pop(argc + 1);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the value, push the result */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}